

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsPseudocost.h
# Opt level: O0

double __thiscall HighsPseudocost::getScoreUp(HighsPseudocost *this,HighsInt col,double frac)

{
  long lVar1;
  double *pdVar2;
  const_reference pvVar3;
  const_reference pvVar4;
  size_type sVar5;
  int in_ESI;
  long in_RDI;
  vector<int,_std::allocator<int>_> *this_00;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  undefined1 auVar10 [16];
  anon_class_1_0_00000001 mapScore;
  double conflictScore;
  double conflictScoreAvg;
  double conflictScoreUp;
  double cutoffScore;
  double avgCutoffs;
  double cutOffScoreUp;
  double inferenceScore;
  double costScore;
  double in_stack_fffffffffffffee8;
  undefined8 in_stack_fffffffffffffef0;
  HighsPseudocost *in_stack_fffffffffffffef8;
  anon_class_1_0_00000001 local_99;
  double local_98;
  double local_90;
  double local_88;
  double local_80;
  double local_78;
  double local_70;
  double local_68;
  double local_60;
  double local_58;
  double local_50;
  double local_48;
  double local_40;
  double local_38;
  double local_30;
  double local_28;
  double local_20;
  int local_c;
  
  local_c = in_ESI;
  dVar6 = getPseudocostUp(in_stack_fffffffffffffef8,
                          (HighsInt)((ulong)in_stack_fffffffffffffef0 >> 0x20),
                          in_stack_fffffffffffffee8);
  local_28 = 1e-06;
  pdVar2 = std::max<double>(&local_28,(double *)(in_RDI + 0x130));
  local_20 = dVar6 / *pdVar2;
  pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x60),(long)local_c);
  dVar6 = *pvVar3;
  local_38 = 1e-06;
  pdVar2 = std::max<double>(&local_38,(double *)(in_RDI + 0x138));
  local_30 = dVar6 / *pdVar2;
  this_00 = (vector<int,_std::allocator<int>_> *)(in_RDI + 0xc0);
  pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](this_00,(long)local_c);
  dVar6 = (double)*pvVar4;
  local_48 = 1.0;
  pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](this_00,(long)local_c);
  dVar7 = (double)*pvVar4;
  pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x30),(long)local_c);
  local_50 = dVar7 + (double)*pvVar4;
  pdVar2 = std::max<double>(&local_48,&local_50);
  local_40 = dVar6 / *pdVar2;
  lVar1 = *(long *)(in_RDI + 0x150);
  local_60 = 1.0;
  local_68 = (double)*(long *)(in_RDI + 0x150) + (double)*(long *)(in_RDI + 0x140);
  pdVar2 = std::max<double>(&local_60,&local_68);
  dVar6 = local_40;
  local_58 = (double)lVar1 / *pdVar2;
  local_78 = 1e-06;
  pdVar2 = std::max<double>(&local_78,&local_58);
  local_70 = dVar6 / *pdVar2;
  pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)(in_RDI + 0xf0),(long)local_c);
  local_80 = *pvVar3 / *(double *)(in_RDI + 0x120);
  dVar6 = *(double *)(in_RDI + 0x120);
  dVar7 = *(double *)(in_RDI + 0x128);
  sVar5 = std::vector<double,_std::allocator<double>_>::size
                    ((vector<double,_std::allocator<double>_> *)(in_RDI + 0xf0));
  dVar8 = local_80;
  auVar10._8_4_ = (int)(sVar5 >> 0x20);
  auVar10._0_8_ = sVar5;
  auVar10._12_4_ = 0x45300000;
  local_88 = dVar7 / (dVar6 * ((auVar10._8_8_ - 1.9342813113834067e+25) +
                              ((double)CONCAT44(0x43300000,(int)sVar5) - 4503599627370496.0)));
  local_98 = 1e-06;
  pdVar2 = std::max<double>(&local_98,&local_88);
  local_90 = dVar8 / *pdVar2;
  dVar6 = getScoreUp::anon_class_1_0_00000001::operator()(&local_99,local_20);
  dVar7 = getScoreUp::anon_class_1_0_00000001::operator()(&local_99,local_90);
  dVar8 = getScoreUp::anon_class_1_0_00000001::operator()(&local_99,local_70);
  dVar9 = getScoreUp::anon_class_1_0_00000001::operator()(&local_99,local_30);
  return dVar6 + dVar7 * 0.01 + (dVar8 + dVar9) * 0.0001;
}

Assistant:

double getScoreUp(HighsInt col, double frac) const {
    double costScore = getPseudocostUp(col, frac) / std::max(1e-6, cost_total);
    double inferenceScore =
        inferencesup[col] / std::max(1e-6, inferences_total);

    double cutOffScoreUp =
        ncutoffsup[col] /
        std::max(1.0, static_cast<double>(ncutoffsup[col]) +
                          static_cast<double>(nsamplesup[col]));
    double avgCutoffs = static_cast<double>(ncutoffstotal) /
                        std::max(1.0, static_cast<double>(ncutoffstotal) +
                                          static_cast<double>(nsamplestotal));

    double cutoffScore = cutOffScoreUp / std::max(1e-6, avgCutoffs);

    double conflictScoreUp = conflictscoreup[col] / conflict_weight;
    double conflictScoreAvg =
        conflict_avg_score /
        (conflict_weight * static_cast<double>(conflictscoreup.size()));
    double conflictScore = conflictScoreUp / std::max(1e-6, conflictScoreAvg);

    auto mapScore = [](double score) { return 1.0 - 1.0 / (1.0 + score); };

    return mapScore(costScore) +
           (1e-2 * mapScore(conflictScore) +
            1e-4 * (mapScore(cutoffScore) + mapScore(inferenceScore)));
  }